

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_is_snp(bcf1_t *v)

{
  uint local_14;
  int i;
  bcf1_t *v_local;
  
  bcf_unpack(v,1);
  local_14 = 0;
  while (((int)local_14 < (int)((uint)((ulong)*(undefined8 *)&v->field_0x10 >> 0x10) & 0xffff) &&
         (((v->d).allele[(int)local_14][1] == '\0' ||
          (((*(v->d).allele[(int)local_14] == '<' && ((v->d).allele[(int)local_14][1] == 'X')) &&
           ((v->d).allele[(int)local_14][2] == '>'))))))) {
    local_14 = local_14 + 1;
  }
  return (int)(local_14 == ((uint)((ulong)*(undefined8 *)&v->field_0x10 >> 0x10) & 0xffff));
}

Assistant:

int bcf_is_snp(bcf1_t *v)
{
    int i;
    bcf_unpack(v, BCF_UN_STR);
    for (i = 0; i < v->n_allele; ++i)
    {
        if ( v->d.allele[i][1]==0 ) continue;

        // mpileup's <X> allele, see also below. This is not completely satisfactory,
        // a general library is here narrowly tailored to fit samtools.
        if ( v->d.allele[i][0]=='<' && v->d.allele[i][1]=='X' && v->d.allele[i][2]=='>' ) continue;

        break;
    }
    return i == v->n_allele;
}